

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O1

LY_ERR ly_in_skip(ly_in *in,size_t count)

{
  LY_ERR LVar1;
  
  if (in == (ly_in *)0x0) {
    LVar1 = LY_EINVAL;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","in","ly_in_skip");
  }
  else if ((in->length == 0) ||
          (LVar1 = LY_EDENIED, count <= in->start + (in->length - (long)in->current))) {
    in->current = in->current + count;
    LVar1 = LY_SUCCESS;
  }
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_in_skip(struct ly_in *in, size_t count)
{
    LY_CHECK_ARG_RET(NULL, in, LY_EINVAL);

    if (in->length && (in->length - (in->current - in->start) < count)) {
        /* EOF */
        return LY_EDENIED;
    }

    in->current += count;
    return LY_SUCCESS;
}